

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

void Fx_ManComputeLevel(Fx_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  Vec_Int_t *pVVar2;
  uint *puVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  
  pVVar1 = p->vCubes;
  if (pVVar1->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  if (0 < pVVar1->pArray->nSize) {
    uVar6 = *pVVar1->pArray->pArray;
    iVar7 = p->nVars;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    iVar10 = 0x10;
    if (0xe < iVar7 - 1U) {
      iVar10 = iVar7;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = iVar10;
    if (iVar10 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar10 << 2);
    }
    pVVar4->pArray = __s;
    pVVar4->nSize = iVar7;
    iVar10 = 0;
    memset(__s,0,(long)iVar7 << 2);
    p->vLevels = pVVar4;
    if (0 < pVVar1->nSize) {
      pVVar2 = pVVar1->pArray;
      lVar5 = 0;
      do {
        if (pVVar2[lVar5].nSize < 1) goto LAB_00265821;
        puVar3 = (uint *)pVVar2[lVar5].pArray;
        if (uVar6 != *puVar3) {
          if (((int)uVar6 < 0) || (pVVar4->nSize <= (int)uVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          __s[uVar6] = __s[uVar6] + ((int)lVar5 - iVar10);
          if (pVVar2[lVar5].nSize < 1) goto LAB_00265821;
          uVar6 = *puVar3;
          iVar10 = (int)lVar5;
        }
        iVar7 = 0;
        if (1 < (long)pVVar2[lVar5].nSize) {
          iVar7 = 0;
          lVar8 = 1;
          do {
            if ((int)puVar3[lVar8] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf2,"int Abc_Lit2Var(int)");
            }
            uVar9 = puVar3[lVar8] >> 1;
            if (pVVar4->nSize <= (int)uVar9) goto LAB_00265821;
            if (iVar7 <= __s[uVar9]) {
              iVar7 = __s[uVar9];
            }
            lVar8 = lVar8 + 1;
          } while (pVVar2[lVar5].nSize != lVar8);
        }
        if (((int)uVar6 < 0) || (pVVar4->nSize <= (int)uVar6)) goto LAB_00265821;
        if (__s[uVar6] < iVar7) {
          __s[uVar6] = iVar7;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar1->nSize);
    }
    return;
  }
LAB_00265821:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Fx_ManComputeLevel( Fx_Man_t * p )
{
    Vec_Int_t * vCube;
    int i, iVar, iFirst = 0;
    iVar = Vec_IntEntry( Vec_WecEntry(p->vCubes,0), 0 );
    p->vLevels = Vec_IntStart( p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
    {
        if ( iVar != Vec_IntEntry(vCube, 0) )
        {
            // add the number of cubes
            Vec_IntAddToEntry( p->vLevels, iVar, i - iFirst );
            iVar = Vec_IntEntry(vCube, 0);
            iFirst = i;
        }
        Vec_IntUpdateEntry( p->vLevels, iVar, Fx_ManComputeLevelCube(p, vCube) );
    }
}